

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::opt::InstrumentPass::AddParameters
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          InstrumentPass *this,Function *func,
          vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          *param_types)

{
  Type *type;
  bool bVar1;
  size_type __n;
  reference ppTVar2;
  IRContext *this_00;
  TypeManager *this_01;
  DefUseManager *this_02;
  pointer inst;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_88;
  initializer_list<spvtools::opt::Operand> local_80;
  uint32_t local_70;
  Op local_6c;
  IRContext *local_68;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_60;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  param_inst;
  uint32_t pid;
  Type *param;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *__range2;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *param_types_local;
  Function *func_local;
  InstrumentPass *this_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *param_ids;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  __n = std::
        vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ::size(param_types);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(__return_storage_ptr__,__n);
  __end2 = std::
           vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
           ::begin(param_types);
  param = (Type *)std::
                  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                  ::end(param_types);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
                                     *)&param), bVar1) {
    ppTVar2 = __gnu_cxx::
              __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
              ::operator*(&__end2);
    type = *ppTVar2;
    param_inst._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
         Pass::TakeNextId(&this->super_Pass);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,
               (value_type_conflict2 *)
               ((long)&param_inst._M_t.
                       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl + 4)
              );
    local_68 = Pass::context(&this->super_Pass);
    local_6c = OpFunctionParameter;
    this_00 = Pass::context(&this->super_Pass);
    this_01 = IRContext::get_type_mgr(this_00);
    local_70 = analysis::TypeManager::GetId(this_01,type);
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_80);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,unsigned_int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_60,&local_68,&local_6c,&local_70,
               (uint *)((long)&param_inst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_80);
    this_02 = Pass::get_def_use_mgr(&this->super_Pass);
    inst = std::
           unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ::get(&local_60);
    analysis::DefUseManager::AnalyzeInstDefUse(this_02,inst);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    unique_ptr(&local_88,&local_60);
    Function::AddParameter(func,&local_88);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_88);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_60);
    __gnu_cxx::
    __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> InstrumentPass::AddParameters(
    Function& func, const std::vector<const analysis::Type*>& param_types) {
  std::vector<uint32_t> param_ids;
  param_ids.reserve(param_types.size());
  for (const analysis::Type* param : param_types) {
    uint32_t pid = TakeNextId();
    param_ids.push_back(pid);
    auto param_inst =
        MakeUnique<Instruction>(context(), spv::Op::OpFunctionParameter,
                                context()->get_type_mgr()->GetId(param), pid,
                                std::initializer_list<Operand>{});
    get_def_use_mgr()->AnalyzeInstDefUse(param_inst.get());
    func.AddParameter(std::move(param_inst));
  }
  return param_ids;
}